

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O3

int dfsplain_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Abc_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  Flow_Data_t *pFVar4;
  ulong uVar5;
  MinRegMan_t *pMVar6;
  ushort uVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  
  uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar2 == 8) goto LAB_004d9a09;
  if (pManMR->fIsForward == 0) {
    pFVar4 = pManMR->pDataArray;
    uVar5 = (ulong)(uint)pObj->Id;
    uVar7 = *(ushort *)(pFVar4 + uVar5);
  }
  else {
    if (uVar2 == 3) {
LAB_004d9a09:
      if (pPred == (Abc_Obj_t *)0x0) {
        __assert_fail("pPred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                      ,0x271,"int dfsplain_r(Abc_Obj_t *, Abc_Obj_t *)");
      }
      return 1;
    }
    pFVar4 = pManMR->pDataArray;
    uVar5 = (ulong)(uint)pObj->Id;
    uVar7 = (ushort)*(uint *)(pFVar4 + uVar5);
    if ((pManMR->constraintMask & *(uint *)(pFVar4 + uVar5) & 0x90) != 0) goto LAB_004d9a09;
  }
  *(ushort *)(pFVar4 + uVar5) = uVar7 | 2;
  pFVar4 = pManMR->pDataArray;
  if ((undefined1  [24])((undefined1  [24])pFVar4[(uint)pObj->Id] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if (((undefined1  [24])((undefined1  [24])pFVar4[(uint)pObj->Id] & (undefined1  [24])0x1) !=
         (undefined1  [24])0x0) || (iVar3 = dfsplain_e(pObj,pObj), iVar3 == 0)) {
LAB_004d9ae2:
      if (pManMR->fIsForward == 0) {
        return 0;
      }
      iVar3 = (pObj->vFanins).nSize;
      pMVar6 = pManMR;
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]];
          if (((undefined1  [24])
               ((undefined1  [24])pMVar6->pDataArray[(uint)pAVar1->Id] & (undefined1  [24])0x2) ==
               (undefined1  [24])0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) != 8)) {
            iVar3 = dfsplain_r(pAVar1,pPred);
            if (iVar3 != 0) {
              return 1;
            }
            iVar3 = (pObj->vFanins).nSize;
            pMVar6 = pManMR;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar3);
      }
      if (pMVar6->maxDelay != 0) {
        uVar5 = (ulong)(uint)pObj->Id;
        if (pMVar6->vTimeEdges[uVar5].nSize < 1) {
          return 0;
        }
        pVVar8 = pMVar6->vTimeEdges + uVar5;
        lVar9 = 0;
        do {
          if ((undefined1  [24])
              ((undefined1  [24])pMVar6->pDataArray[(uint)((Abc_Obj_t *)pVVar8->pArray[lVar9])->Id]
              & (undefined1  [24])0x2) == (undefined1  [24])0x0) {
            iVar3 = dfsplain_r((Abc_Obj_t *)pVVar8->pArray[lVar9],pPred);
            if (iVar3 != 0) {
              return 1;
            }
            uVar5 = (ulong)(uint)pObj->Id;
            pMVar6 = pManMR;
          }
          lVar9 = lVar9 + 1;
          pVVar8 = pMVar6->vTimeEdges + uVar5;
        } while (lVar9 < pMVar6->vTimeEdges[uVar5].nSize);
        return 0;
      }
      return 0;
    }
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretime.h"
                    ,0x8d,"void FSETPRED(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pManMR->pDataArray[(uint)pObj->Id].field_1.pred = pPred;
  }
  else {
    pAVar1 = pFVar4[(uint)pObj->Id].field_1.pred;
    if (((pAVar1 == (Abc_Obj_t *)0x0) ||
        ((undefined1  [24])((undefined1  [24])pFVar4[(uint)pAVar1->Id] & (undefined1  [24])0x1) !=
         (undefined1  [24])0x0)) || (iVar3 = dfsplain_e(pAVar1,pAVar1), iVar3 == 0))
    goto LAB_004d9ae2;
    FSETPRED(pObj,pPred);
  }
  return 1;
}

Assistant:

int dfsplain_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) || 
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  // printf(" %dr\n", Abc_ObjId(pObj));

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        dfsplain_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        dfsplain_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. follow reverse edges
  if (pManMR->fIsForward) { // forward retiming only
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  return 1;
}